

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_16::NameResolver::CheckDuplicateBindings
          (NameResolver *this,BindingHash *bindings,char *desc)

{
  anon_class_16_2_3fdee84c local_50;
  DuplicateCallback local_40;
  char *local_20;
  char *desc_local;
  BindingHash *bindings_local;
  NameResolver *this_local;
  
  local_50.this = this;
  local_50.desc = desc;
  local_20 = desc;
  desc_local = (char *)bindings;
  bindings_local = (BindingHash *)this;
  std::
  function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>
  ::
  function<wabt::(anonymous_namespace)::NameResolver::CheckDuplicateBindings(wabt::BindingHash_const*,char_const*)::__0,void>
            ((function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>
              *)&local_40,&local_50);
  BindingHash::FindDuplicates(bindings,&local_40);
  std::
  function<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&)>
  ::~function(&local_40);
  return;
}

Assistant:

void NameResolver::CheckDuplicateBindings(const BindingHash* bindings,
                                          const char* desc) {
  bindings->FindDuplicates([this, desc](const BindingHash::value_type& a,
                                        const BindingHash::value_type& b) {
    PrintDuplicateBindingsError(a, b, desc);
  });
}